

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImBitVector *this;
  uint *puVar1;
  stbtt_uint8 sVar2;
  byte bVar3;
  ImWchar IVar4;
  ushort uVar5;
  uint uVar6;
  ImFont *pIVar7;
  ImFont **ppIVar8;
  stbtt_uint8 *data;
  void *pvVar9;
  undefined8 *puVar10;
  ImFontConfig *pIVar11;
  stbrp_node *psVar12;
  stbtt__buf fontdict;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined8 ptr;
  size_t sVar16;
  bool bVar17;
  ushort uVar18;
  short sVar19;
  stbtt_uint32 sVar20;
  stbtt_uint32 sVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  stbtt__active_edge *z;
  stbtt_uint32 sVar21;
  stbtt_uint32 sVar22;
  stbtt_uint32 sVar23;
  stbtt_uint32 sVar24;
  stbtt_uint32 sVar25;
  ulong uVar30;
  int *piVar31;
  void *pvVar32;
  void *pvVar33;
  stbrp_context *ptr_00;
  uchar *puVar34;
  long lVar35;
  stbtt__point *points;
  stbtt__edge *p_00;
  stbtt__buf *scanline;
  stbtt__buf *psVar36;
  undefined1 auVar37 [8];
  undefined8 *puVar38;
  short sVar39;
  int iVar40;
  long lVar41;
  ulong uVar42;
  ImWchar *pIVar43;
  uint *puVar44;
  ulong uVar45;
  stbtt__active_edge *psVar46;
  stbtt__active_edge *psVar47;
  char *__function;
  uint uVar48;
  long lVar49;
  long lVar50;
  size_t sVar51;
  byte *pbVar52;
  uint uVar53;
  ushort *puVar54;
  uchar uVar55;
  ulong uVar56;
  size_t size;
  byte *pbVar57;
  ImFontConfig *pIVar58;
  long lVar59;
  ulong uVar60;
  int iVar61;
  ulong uVar62;
  int iVar63;
  ImU32 bit_n;
  uint uVar64;
  stbtt__edge *psVar65;
  byte bVar66;
  void *p;
  stbtt_fontinfo *psVar67;
  stbtt__active_edge *psVar68;
  long lVar69;
  bool bVar70;
  float fVar71;
  float fVar72;
  undefined4 uVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float in_XMM3_Da;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  stbtt__buf sVar82;
  float y0_2;
  int y1;
  stbtt_uint32 charstrings;
  ImVector<stbrp_rect> buf_rects;
  ImVector<stbtt_packedchar> buf_packedchars;
  stbtt_uint32 fdarrayoff;
  int y0_1;
  int x0_1;
  int iy0;
  int x1_1;
  stbtt__buf b;
  undefined4 in_stack_fffffffffffffb64;
  undefined4 uVar83;
  void *__s;
  undefined4 uVar84;
  undefined8 in_stack_fffffffffffffb90;
  float local_468;
  int local_450;
  stbtt_uint32 local_44c;
  void *local_448;
  undefined1 local_440 [8];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  ulong local_410;
  ulong local_408;
  int local_3fc;
  void *local_3f8;
  stbtt__active_edge *local_3f0;
  undefined8 local_3e8;
  void *pvStack_3e0;
  stbrp_node *local_3d0;
  ulong local_3c8;
  undefined8 local_3c0;
  float local_3b4;
  float local_3b0;
  uint local_3ac;
  undefined1 local_3a8 [16];
  stbtt_fontinfo *local_390;
  undefined8 *local_388;
  float local_380;
  float local_37c;
  int local_378;
  float local_374;
  long local_370;
  long local_368;
  ulong local_360;
  uchar *local_358;
  stbtt__point *local_350;
  uchar *local_348;
  ulong local_340;
  ulong local_338;
  float *local_330;
  size_t local_328;
  float local_320;
  float local_31c;
  uint local_318;
  uint local_314;
  int local_310;
  int local_30c;
  float local_308;
  int local_304;
  int local_300;
  int local_2fc;
  undefined1 local_2f8 [16];
  stbrp_context *local_2e8;
  float *local_2e0;
  float local_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  size_t local_2c0;
  ImFontConfig *local_2b8;
  long local_2b0;
  short *local_2a8;
  long local_2a0;
  ulong local_298;
  ulong local_290;
  long local_288;
  size_t local_280;
  size_t local_278;
  int local_270;
  int local_26c;
  undefined1 local_268 [16];
  stbtt__buf local_258 [33];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_3a8._8_8_ = local_3a8._0_8_;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                  ,0x929,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  __s = (void *)0x0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  uVar6 = (atlas->ConfigData).Size;
  lVar41 = (long)(int)uVar6;
  if (0 < lVar41) {
    uVar30 = 8;
    if (8 < (int)uVar6) {
      uVar30 = (ulong)uVar6;
    }
    __s = ImGui::MemAlloc(uVar30 * 0x110);
  }
  uVar27 = (atlas->Fonts).Size;
  lVar69 = (long)(int)uVar27;
  if (lVar69 < 1) {
    local_3f8 = (void *)0x0;
  }
  else {
    uVar30 = 8;
    if (8 < (int)uVar27) {
      uVar30 = (ulong)uVar27;
    }
    local_3f8 = ImGui::MemAlloc(uVar30 << 5);
  }
  local_2c0 = lVar41 * 0x110;
  memset(__s,0,local_2c0);
  local_328 = lVar69 << 5;
  memset(local_3f8,0,local_328);
  uVar27 = (atlas->ConfigData).Size;
  uVar30 = (ulong)uVar27;
  uVar83 = CONCAT13((int)uVar27 < 1,(int3)in_stack_fffffffffffffb64);
  local_3a8._0_8_ = lVar69;
  if (0 < (int)uVar27) {
    uVar42 = 0;
    if (0 < (int)uVar6) {
      uVar42 = (ulong)uVar6;
    }
    local_2f8._0_8_ = uVar42;
    lVar59 = 0;
    pvVar33 = __s;
    do {
      if (lVar59 == local_2f8._0_8_) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_0015cd00;
      }
      if ((int)uVar30 <= lVar59) goto LAB_0015cd67;
      pIVar58 = (atlas->ConfigData).Data;
      pIVar7 = pIVar58[lVar59].DstFont;
      if ((pIVar7 == (ImFont *)0x0) ||
         (pIVar7->ContainerAtlas != atlas && pIVar7->ContainerAtlas != (ImFontAtlas *)0x0)) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                      ,0x941,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)pvVar33 + lVar59 * 0x110 + 0xe0) = 0xffffffff;
      uVar30 = (ulong)(atlas->Fonts).Size;
      if ((long)uVar30 < 1) {
LAB_0015cdb7:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                      ,0x94a,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar58 = pIVar58 + lVar59;
      ppIVar8 = (atlas->Fonts).Data;
      uVar56 = 0xffffffff;
      uVar42 = 0;
      do {
        if (pIVar7 == ppIVar8[uVar42]) {
          *(int *)((long)pvVar33 + lVar59 * 0x110 + 0xe0) = (int)uVar42;
          uVar56 = uVar42 & 0xffffffff;
        }
        uVar42 = uVar42 + 1;
      } while ((uVar42 < uVar30) && ((int)uVar56 == -1));
      if ((int)uVar56 == -1) goto LAB_0015cdb7;
      uVar73 = (undefined4)lVar59;
      uVar84 = (undefined4)((ulong)lVar59 >> 0x20);
      data = (stbtt_uint8 *)pIVar58->FontData;
      iVar28 = pIVar58->FontNo;
      sVar2 = *data;
      if (((((sVar2 == '1') && (data[1] == '\0')) && (data[2] == '\0')) && (data[3] == '\0')) ||
         (((sVar2 == 't' && (data[1] == 'y')) && ((data[2] == 'p' && (data[3] == '1')))))) {
LAB_00159d25:
        sVar26 = -(uint)(iVar28 != 0);
      }
      else {
        if (sVar2 == '\0') {
          if (((data[1] != '\x01') || (data[2] != '\0')) || (data[3] != '\0')) goto LAB_00159cfd;
          goto LAB_00159d25;
        }
        if ((((sVar2 == 'O') && (data[1] == 'T')) && (data[2] == 'T')) && (data[3] == 'O'))
        goto LAB_00159d25;
LAB_00159cfd:
        sVar26 = 0xffffffff;
        if (sVar2 == 't') {
          if (data[1] == 't') {
            if ((data[2] == 'c') && (data[3] == 'f')) {
              uVar27 = *(uint *)(data + 4);
              uVar27 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                       uVar27 << 0x18;
              if (((uVar27 == 0x20000) || (uVar27 == 0x10000)) &&
                 (uVar27 = *(uint *)(data + 8),
                 iVar28 < (int)(uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                               uVar27 << 0x18))) {
                uVar27 = *(uint *)(data + (long)iVar28 * 4 + 0xc);
                sVar26 = uVar27 >> 0x18 | (uVar27 & 0xff0000) >> 8 | (uVar27 & 0xff00) << 8 |
                         uVar27 << 0x18;
              }
            }
          }
          else if (((data[1] == 'r') && (data[2] == 'u')) && (data[3] == 'e')) goto LAB_00159d25;
        }
      }
      if ((int)sVar26 < 0) {
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                      ,0x94f,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(stbtt_uint8 **)((long)pvVar33 + lVar59 * 0x110 + 8) = data;
      *(stbtt_uint32 *)((long)pvVar33 + lVar59 * 0x110 + 0x10) = sVar26;
      *(undefined8 *)((long)pvVar33 + lVar59 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)pvVar33 + lVar59 * 0x110 + 0x48) = 0;
      __s = pvVar33;
      sVar20 = stbtt__find_table(data,sVar26,"cmap");
      sVar21 = stbtt__find_table(data,sVar26,"loca");
      *(stbtt_uint32 *)((long)pvVar33 + lVar59 * 0x110 + 0x18) = sVar21;
      sVar22 = stbtt__find_table(data,sVar26,"head");
      local_428._0_4_ = sVar22;
      *(stbtt_uint32 *)((long)pvVar33 + lVar59 * 0x110 + 0x1c) = sVar22;
      sVar22 = stbtt__find_table(data,sVar26,"glyf");
      *(stbtt_uint32 *)((long)pvVar33 + lVar59 * 0x110 + 0x20) = sVar22;
      sVar23 = stbtt__find_table(data,sVar26,"hhea");
      *(stbtt_uint32 *)((long)pvVar33 + lVar59 * 0x110 + 0x24) = sVar23;
      sVar24 = stbtt__find_table(data,sVar26,"hmtx");
      *(stbtt_uint32 *)((long)pvVar33 + lVar59 * 0x110 + 0x28) = sVar24;
      sVar25 = stbtt__find_table(data,sVar26,"kern");
      *(stbtt_uint32 *)((long)pvVar33 + lVar59 * 0x110 + 0x2c) = sVar25;
      sVar25 = stbtt__find_table(data,sVar26,"GPOS");
      *(stbtt_uint32 *)((long)pvVar33 + lVar59 * 0x110 + 0x30) = sVar25;
      if ((((sVar20 == 0) || ((float)local_428._0_4_ == 0.0)) || (sVar23 == 0)) || (sVar24 == 0))
      goto LAB_0015cbd9;
      if (sVar22 == 0) {
        local_3e8 = CONCAT44(local_3e8._4_4_,2);
        local_440 = (undefined1  [8])((ulong)local_440 & 0xffffffff00000000);
        local_3c0._0_4_ = 0;
        local_44c = 0;
        sVar22 = stbtt__find_table(data,sVar26,"CFF ");
        if (sVar22 == 0) goto LAB_0015cbd9;
        *(undefined8 *)((long)pvVar33 + lVar59 * 0x110 + 0x90) = 0;
        *(undefined8 *)((long)pvVar33 + lVar59 * 0x110 + 0x98) = 0;
        *(undefined8 *)((long)pvVar33 + lVar59 * 0x110 + 0x80) = 0;
        *(undefined8 *)((long)pvVar33 + lVar59 * 0x110 + 0x88) = 0;
        *(stbtt_uint8 **)((long)pvVar33 + lVar59 * 0x110 + 0x40) = data + sVar22;
        *(undefined8 *)((long)pvVar33 + lVar59 * 0x110 + 0x48) = 0x2000000000000000;
        local_258[0].data = *(uchar **)((long)pvVar33 + lVar59 * 0x110 + 0x40);
        local_258[0]._8_8_ = *(undefined8 *)((long)pvVar33 + lVar59 * 0x110 + 0x48);
        if ((long)local_258[0].cursor < -2) {
LAB_0015ce29:
          __assert_fail("!(o > b->size || o < 0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                        ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
        }
        lVar69 = (long)local_258[0].cursor + 2;
        iVar28 = (int)lVar69;
        if (local_258[0].size < iVar28) goto LAB_0015ce29;
        uVar27 = 0;
        if (iVar28 < local_258[0].size) {
          iVar28 = local_258[0].cursor + 3;
          uVar27 = (uint)local_258[0].data[lVar69];
        }
        local_258[0].cursor = iVar28;
        if (local_258[0].size < (int)uVar27) goto LAB_0015ce29;
        local_258[0].cursor = uVar27;
        stbtt__cff_get_index(local_258);
        sVar82 = stbtt__cff_get_index(local_258);
        local_438 = (undefined1  [16])stbtt__cff_index_get(sVar82,0);
        stbtt__cff_get_index(local_258);
        sVar82 = stbtt__cff_get_index(local_258);
        *(stbtt__buf *)((long)pvVar33 + lVar59 * 0x110 + 0x60) = sVar82;
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x11,1,(stbtt_uint32 *)local_440);
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x106,1,(stbtt_uint32 *)&local_3e8);
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x124,1,(stbtt_uint32 *)&local_3c0);
        stbtt__dict_get_ints((stbtt__buf *)local_438,0x125,1,&local_44c);
        sVar82.data._4_4_ = uVar83;
        sVar82.data._0_4_ = sVar21;
        sVar82._8_8_ = __s;
        fontdict.data._4_4_ = uVar84;
        fontdict.data._0_4_ = uVar73;
        fontdict.cursor = (int)in_stack_fffffffffffffb90;
        fontdict.size = (int)((ulong)in_stack_fffffffffffffb90 >> 0x20);
        sVar82 = stbtt__get_subrs(sVar82,fontdict);
        sVar21 = local_44c;
        *(stbtt__buf *)((long)pvVar33 + lVar59 * 0x110 + 0x70) = sVar82;
        if (((stbtt_uint32)local_3e8 != 2) || (uVar15 = local_440._0_4_, local_440._0_4_ == 0))
        goto LAB_0015cbd9;
        if ((stbtt_uint32)local_3c0 != 0) {
          uVar30 = (ulong)local_44c;
          if (uVar30 == 0) goto LAB_0015cbd9;
          if (((int)(stbtt_uint32)local_3c0 < 0) ||
             (local_258[0].size < (int)(stbtt_uint32)local_3c0)) goto LAB_0015ce29;
          local_258[0].cursor = (stbtt_uint32)local_3c0;
          sVar82 = stbtt__cff_get_index(local_258);
          *(stbtt__buf *)((long)pvVar33 + lVar59 * 0x110 + 0x80) = sVar82;
          puVar34 = local_258[0].data + uVar30;
          lVar69 = (ulong)(local_258[0].size - sVar21) << 0x20;
          if ((int)(local_258[0].size - sVar21 | sVar21) < 0 || local_258[0].size < (int)sVar21) {
            puVar34 = (uchar *)0x0;
            lVar69 = 0;
          }
          *(uchar **)((long)pvVar33 + lVar59 * 0x110 + 0x90) = puVar34;
          *(long *)((long)pvVar33 + lVar59 * 0x110 + 0x98) = lVar69;
        }
        if (((int)uVar15 < 0) || (local_258[0].size < (int)uVar15)) goto LAB_0015ce29;
        local_258[0].cursor = uVar15;
        sVar82 = stbtt__cff_get_index(local_258);
        *(stbtt__buf *)((long)pvVar33 + lVar59 * 0x110 + 0x50) = sVar82;
      }
      else if (sVar21 == 0) goto LAB_0015cbd9;
      sVar26 = stbtt__find_table(data,sVar26,"maxp");
      if (sVar26 == 0) {
        uVar27 = 0xffff;
      }
      else {
        uVar27 = (uint)(ushort)(*(ushort *)(data + (ulong)sVar26 + 4) << 8 |
                               *(ushort *)(data + (ulong)sVar26 + 4) >> 8);
      }
      *(uint *)((long)pvVar33 + lVar59 * 0x110 + 0x14) = uVar27;
      uVar18 = *(ushort *)(data + (ulong)sVar20 + 2) << 8 |
               *(ushort *)(data + (ulong)sVar20 + 2) >> 8;
      *(undefined4 *)((long)pvVar33 + lVar59 * 0x110 + 0x34) = 0;
      if (uVar18 != 0) {
        uVar27 = sVar20 + 4;
        uVar30 = (ulong)uVar18;
        do {
          uVar18 = *(ushort *)(data + uVar27) << 8 | *(ushort *)(data + uVar27) >> 8;
          if ((uVar18 == 0) ||
             ((uVar18 == 3 &&
              ((uVar18 = *(ushort *)(data + (ulong)uVar27 + 2) << 8 |
                         *(ushort *)(data + (ulong)uVar27 + 2) >> 8, uVar18 == 10 || (uVar18 == 1)))
              ))) {
            uVar53 = *(uint *)(data + (ulong)uVar27 + 4);
            *(uint *)((long)pvVar33 + lVar59 * 0x110 + 0x34) =
                 (uVar53 >> 0x18 | (uVar53 & 0xff0000) >> 8 | (uVar53 & 0xff00) << 8 |
                 uVar53 << 0x18) + sVar20;
          }
          uVar27 = uVar27 + 8;
          uVar30 = uVar30 - 1;
        } while (uVar30 != 0);
      }
      if (*(int *)((long)pvVar33 + lVar59 * 0x110 + 0x34) == 0) goto LAB_0015cbd9;
      *(uint *)((long)pvVar33 + lVar59 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (data + (long)*(int *)((long)pvVar33 + lVar59 * 0x110 + 0x1c) + 0x32) <<
                          8 | *(ushort *)
                               (data + (long)*(int *)((long)pvVar33 + lVar59 * 0x110 + 0x1c) + 0x32)
                              >> 8);
      iVar28 = *(int *)((long)pvVar33 + lVar59 * 0x110 + 0xe0);
      if (((long)iVar28 < 0) || (local_3a8._0_4_ <= iVar28)) goto LAB_0015cd7e;
      pIVar43 = pIVar58->GlyphRanges;
      if (pIVar43 == (ImWchar *)0x0) {
        pIVar43 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvVar33 + lVar59 * 0x110 + 0xd8) = pIVar43;
      IVar4 = *pIVar43;
      while (IVar4 != 0) {
        uVar18 = pIVar43[1];
        if (uVar18 == 0) break;
        uVar27 = *(uint *)((long)pvVar33 + lVar59 * 0x110 + 0xe4);
        uVar53 = (uint)uVar18;
        if ((int)(uint)uVar18 < (int)uVar27) {
          uVar53 = uVar27;
        }
        *(uint *)((long)pvVar33 + lVar59 * 0x110 + 0xe4) = uVar53;
        IVar4 = pIVar43[2];
        pIVar43 = pIVar43 + 2;
      }
      piVar31 = (int *)((long)iVar28 * 0x20 + (long)local_3f8);
      *piVar31 = *piVar31 + 1;
      iVar28 = *(int *)((long)pvVar33 + lVar59 * 0x110 + 0xe4);
      if (iVar28 < piVar31[1]) {
        iVar28 = piVar31[1];
      }
      piVar31[1] = iVar28;
      lVar59 = CONCAT44(uVar84,uVar73) + 1;
      uVar30 = (ulong)(atlas->ConfigData).Size;
      uVar83 = CONCAT13((long)uVar30 <= lVar59,(int3)uVar83);
      lVar69 = local_3a8._0_8_;
      pvVar33 = __s;
    } while (lVar59 < (long)uVar30);
  }
  uVar27 = 0;
  if (0 < (int)uVar6) {
    lVar59 = 0;
    uVar27 = 0;
    do {
      iVar28 = *(int *)((long)__s + lVar59 * 0x110 + 0xe0);
      lVar50 = (long)iVar28;
      if ((lVar50 < 0) || ((int)lVar69 <= iVar28)) goto LAB_0015cd7e;
      local_428._0_8_ = lVar59;
      psVar67 = (stbtt_fontinfo *)(lVar59 * 0x110 + (long)__s);
      ImBitVector::Create((ImBitVector *)&psVar67[1].charstrings,
                          *(int *)((long)&psVar67[1].cff.data + 4) + 1);
      pvVar33 = local_3f8;
      this = (ImBitVector *)((long)local_3f8 + lVar50 * 0x20 + 0x10);
      if (*(int *)((long)local_3f8 + lVar50 * 0x20 + 0x10) == 0) {
        ImBitVector::Create(this,*(int *)((long)local_3f8 + lVar50 * 0x20 + 4) + 1);
      }
      puVar54 = *(ushort **)&psVar67[1].indexToLocFormat;
      uVar18 = *puVar54;
      for (; (uVar53 = (uint)uVar18, uVar18 != 0 && (puVar54[1] != 0)); puVar54 = puVar54 + 2) {
        if (uVar18 <= puVar54[1]) {
          do {
            bVar17 = ImBitVector::TestBit(this,uVar53);
            if ((!bVar17) && (iVar28 = stbtt_FindGlyphIndex(psVar67,uVar53), iVar28 != 0)) {
              piVar31 = &psVar67[1].cff.cursor;
              *piVar31 = *piVar31 + 1;
              piVar31 = (int *)((long)pvVar33 + lVar50 * 0x20 + 8);
              *piVar31 = *piVar31 + 1;
              ImBitVector::SetBit((ImBitVector *)&psVar67[1].charstrings,uVar53);
              ImBitVector::SetBit(this,uVar53);
              uVar27 = uVar27 + 1;
            }
            bVar17 = uVar53 < puVar54[1];
            uVar53 = uVar53 + 1;
          } while (bVar17);
        }
        uVar18 = puVar54[2];
      }
      lVar59 = local_428._0_8_ + 1;
      lVar69 = local_3a8._0_8_;
    } while (lVar59 != lVar41);
  }
  if (0 < (int)uVar6) {
    lVar69 = 0;
    pvVar33 = __s;
    do {
      uVar73 = (undefined4)lVar69;
      uVar84 = (undefined4)((ulong)lVar69 >> 0x20);
      lVar69 = lVar69 * 0x110;
      iVar28 = *(int *)((long)pvVar33 + lVar69 + 0xe8);
      __s = pvVar33;
      if (*(int *)((long)pvVar33 + lVar69 + 0x104) < iVar28) {
        pvVar32 = ImGui::MemAlloc((long)iVar28 << 2);
        pvVar9 = *(void **)((long)pvVar33 + lVar69 + 0x108);
        if (pvVar9 != (void *)0x0) {
          memcpy(pvVar32,pvVar9,(long)*(int *)((long)pvVar33 + lVar69 + 0x100) << 2);
          ImGui::MemFree(*(void **)((long)pvVar33 + lVar69 + 0x108));
        }
        *(void **)((long)pvVar33 + lVar69 + 0x108) = pvVar32;
        *(int *)((long)pvVar33 + lVar69 + 0x104) = iVar28;
      }
      lVar59 = (long)*(int *)((long)pvVar33 + lVar69 + 0xf0);
      if (0 < lVar59) {
        puVar44 = *(uint **)((long)pvVar33 + lVar69 + 0xf8);
        puVar1 = puVar44 + lVar59;
        iVar28 = 0;
        do {
          local_428._0_8_ = puVar44;
          uVar53 = *puVar44;
          if (uVar53 != 0) {
            uVar64 = 0;
            do {
              if ((uVar53 >> (uVar64 & 0x1f) & 1) != 0) {
                iVar63 = *(int *)((long)pvVar33 + lVar69 + 0x100);
                iVar29 = *(int *)((long)pvVar33 + lVar69 + 0x104);
                if (iVar63 == iVar29) {
                  if (iVar29 == 0) {
                    iVar40 = 8;
                  }
                  else {
                    iVar40 = iVar29 / 2 + iVar29;
                  }
                  iVar63 = iVar63 + 1;
                  if (iVar63 < iVar40) {
                    iVar63 = iVar40;
                  }
                  if (iVar29 < iVar63) {
                    pvVar32 = ImGui::MemAlloc((long)iVar63 << 2);
                    pvVar9 = *(void **)((long)pvVar33 + lVar69 + 0x108);
                    if (pvVar9 != (void *)0x0) {
                      memcpy(pvVar32,pvVar9,(long)*(int *)((long)pvVar33 + lVar69 + 0x100) << 2);
                      ImGui::MemFree(*(void **)((long)pvVar33 + lVar69 + 0x108));
                    }
                    *(void **)((long)pvVar33 + lVar69 + 0x108) = pvVar32;
                    *(int *)((long)pvVar33 + lVar69 + 0x104) = iVar63;
                  }
                }
                *(uint *)(*(long *)((long)pvVar33 + lVar69 + 0x108) +
                         (long)*(int *)((long)pvVar33 + lVar69 + 0x100) * 4) = iVar28 + uVar64;
                piVar31 = (int *)((long)pvVar33 + lVar69 + 0x100);
                *piVar31 = *piVar31 + 1;
              }
              uVar64 = uVar64 + 1;
            } while (uVar64 != 0x20);
          }
          puVar44 = (uint *)(local_428._0_8_ + 4);
          iVar28 = iVar28 + 0x20;
        } while (puVar44 < puVar1);
      }
      pvVar9 = *(void **)((long)pvVar33 + lVar69 + 0xf8);
      if (pvVar9 != (void *)0x0) {
        *(undefined8 *)((long)pvVar33 + lVar69 + 0xf0) = 0;
        ImGui::MemFree(pvVar9);
        *(undefined8 *)((long)pvVar33 + lVar69 + 0xf8) = 0;
      }
      if (*(int *)((long)pvVar33 + lVar69 + 0x100) != *(int *)((long)pvVar33 + lVar69 + 0xe8)) {
        __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                      ,0x97e,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      lVar69 = CONCAT44(uVar84,uVar73) + 1;
      pvVar33 = __s;
    } while (lVar69 != lVar41);
  }
  sVar16 = local_328;
  pvVar33 = local_3f8;
  if (0 < (int)local_3a8._0_4_) {
    sVar51 = 0;
    do {
      pvVar9 = *(void **)((long)pvVar33 + sVar51 + 0x18);
      if (pvVar9 != (void *)0x0) {
        *(undefined8 *)((long)pvVar33 + sVar51 + 0x10) = 0;
        ImGui::MemFree(pvVar9);
        *(undefined8 *)((long)pvVar33 + sVar51 + 0x18) = 0;
      }
      sVar51 = sVar51 + 0x20;
    } while (sVar16 != sVar51);
  }
  if (local_3f8 != (void *)0x0) {
    ImGui::MemFree(local_3f8);
    local_3f8 = (void *)0x0;
  }
  local_438 = ZEXT816(0);
  local_3e8 = 0;
  pvStack_3e0 = (void *)0x0;
  if (0 < (int)uVar27) {
    uVar53 = 8;
    if (7 < (int)uVar27) {
      uVar53 = uVar27;
    }
    if (0 < (int)uVar53) {
      pvVar33 = ImGui::MemAlloc((long)(int)uVar53 << 4);
      if ((void *)local_438._8_8_ != (void *)0x0) {
        memcpy(pvVar33,(void *)local_438._8_8_,(long)(int)local_438._0_4_ << 4);
        ImGui::MemFree((void *)local_438._8_8_);
      }
      auVar14._4_8_ = pvVar33;
      auVar14._0_4_ = uVar53;
      auVar14._12_4_ = 0;
      local_438 = auVar14 << 0x20;
    }
  }
  local_438._0_4_ = uVar27;
  if (local_3e8._4_4_ < (int)uVar27) {
    if (local_3e8._4_4_ == 0) {
      uVar53 = 8;
    }
    else {
      uVar53 = local_3e8._4_4_ / 2 + local_3e8._4_4_;
    }
    if ((int)uVar53 <= (int)uVar27) {
      uVar53 = uVar27;
    }
    if (local_3e8._4_4_ < (int)uVar53) {
      pvVar33 = ImGui::MemAlloc((long)(int)uVar53 * 0x1c);
      if (pvStack_3e0 != (void *)0x0) {
        memcpy(pvVar33,pvStack_3e0,(long)(int)(stbtt_uint32)local_3e8 * 0x1c);
        ImGui::MemFree(pvStack_3e0);
      }
      local_3e8 = (ulong)uVar53 << 0x20;
      pvStack_3e0 = pvVar33;
    }
  }
  local_3e8 = CONCAT44(local_3e8._4_4_,uVar27);
  iVar28 = 0;
  memset((void *)local_438._8_8_,0,(long)(int)local_438._0_4_ << 4);
  memset(pvStack_3e0,0,(long)(int)(stbtt_uint32)local_3e8 * 0x1c);
  fVar71 = 0.0;
  if (0 < (int)uVar6) {
    lVar69 = 0;
    uVar27 = 0;
    uVar53 = 0;
    do {
      iVar63 = *(int *)((long)__s + lVar69 * 0x110 + 0xe8);
      if (iVar63 != 0) {
        if (((int)uVar27 < 0) || ((int)local_438._0_4_ <= (int)uVar27)) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_0015cd00;
        }
        psVar67 = (stbtt_fontinfo *)(lVar69 * 0x110 + (long)__s);
        *(ulong *)&psVar67[1].hmtx = (ulong)uVar27 * 0x10 + local_438._8_8_;
        if (((int)uVar53 < 0) || ((int)(stbtt_uint32)local_3e8 <= (int)uVar53)) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_0015cd00;
        }
        pvVar33 = (void *)((ulong)uVar53 * 0x1c + (long)pvStack_3e0);
        *(void **)&psVar67[1].gpos = pvVar33;
        if ((atlas->ConfigData).Size <= lVar69) goto LAB_0015cd67;
        pIVar58 = (atlas->ConfigData).Data;
        fVar71 = pIVar58[lVar69].SizePixels;
        *(float *)&psVar67[1].userdata = fVar71;
        *(undefined4 *)((long)&psVar67[1].userdata + 4) = 0;
        psVar67[1].data = *(uchar **)&psVar67[1].gsubrs.cursor;
        psVar67[1].fontstart = *(int *)&psVar67[1].gsubrs.data;
        *(void **)&psVar67[1].loca = pvVar33;
        *(char *)&psVar67[1].glyf = (char)pIVar58[lVar69].OversampleH;
        *(char *)((long)&psVar67[1].glyf + 1) = (char)pIVar58[lVar69].OversampleV;
        if (fVar71 <= 0.0) {
          fVar71 = -fVar71;
          uVar64 = (uint)(ushort)(*(ushort *)(psVar67->data + (long)psVar67->head + 0x12) << 8 |
                                 *(ushort *)(psVar67->data + (long)psVar67->head + 0x12) >> 8);
        }
        else {
          puVar34 = psVar67->data;
          lVar59 = (long)psVar67->hhea;
          uVar64 = ((int)(short)((ushort)puVar34[lVar59 + 4] << 8) | (uint)puVar34[lVar59 + 5]) -
                   ((int)(short)((ushort)puVar34[lVar59 + 6] << 8) | (uint)puVar34[lVar59 + 7]);
        }
        fVar71 = fVar71 / (float)(int)uVar64;
        uVar27 = uVar27 + iVar63;
        uVar53 = uVar53 + iVar63;
        if (0 < *(int *)&psVar67[1].gsubrs.data) {
          local_428._0_8_ = lVar69;
          iVar63 = atlas->TexGlyphPadding;
          lVar50 = 6;
          lVar59 = 0;
          do {
            if (*(int *)&psVar67[1].gsubrs.data <= lVar59) goto LAB_0015cceb;
            iVar29 = stbtt_FindGlyphIndex
                               (psVar67,*(int *)(*(long *)&psVar67[1].gsubrs.cursor + lVar59 * 4));
            if (iVar29 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_draw.cpp"
                            ,0x9ad,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar67,iVar29,(float)pIVar58[lVar69].OversampleH * fVar71,
                       (float)pIVar58[lVar69].OversampleV * fVar71,fVar71,in_XMM3_Da,
                       (int *)local_258,(int *)local_440,(int *)&local_3c0,(int *)&local_44c);
            uVar64 = (pIVar58[lVar69].OversampleH +
                     (((stbtt_uint32)local_3c0 + iVar63) - (int)local_258[0].data)) - 1;
            lVar49 = *(long *)&psVar67[1].hmtx;
            *(short *)(lVar49 + -2 + lVar50) = (short)uVar64;
            uVar48 = (pIVar58[lVar69].OversampleV + ((local_44c + iVar63) - local_440._0_4_)) - 1;
            *(short *)(lVar49 + lVar50) = (short)uVar48;
            iVar28 = iVar28 + (uVar48 & 0xffff) * (uVar64 & 0xffff);
            lVar59 = lVar59 + 1;
            lVar50 = lVar50 + 0x10;
          } while (lVar59 < *(int *)&psVar67[1].gsubrs.data);
          lVar69 = local_428._0_8_;
        }
      }
      lVar69 = lVar69 + 1;
    } while (lVar69 != lVar41);
    fVar71 = (float)iVar28;
  }
  if (fVar71 < 0.0) {
    fVar71 = sqrtf(fVar71);
  }
  else {
    fVar71 = SQRT(fVar71);
  }
  atlas->TexHeight = 0;
  iVar28 = atlas->TexDesiredWidth;
  if (iVar28 < 1) {
    iVar63 = (int)fVar71;
    iVar28 = 0x1000;
    if ((iVar63 < 0xb33) && (iVar28 = 0x800, iVar63 < 0x599)) {
      iVar28 = (uint)(0x2cb < iVar63) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar28;
  local_450 = atlas->TexGlyphPadding;
  ptr_00 = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar63 = iVar28 - local_450;
  local_3d0 = (stbrp_node *)ImGui::MemAlloc((long)iVar63 << 4);
  if ((ptr_00 == (stbrp_context *)0x0) || (local_3d0 == (stbrp_node *)0x0)) {
    if (ptr_00 != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr_00);
    }
    if (local_3d0 != (stbrp_node *)0x0) {
      ImGui::MemFree(local_3d0);
    }
    local_3d0 = (stbrp_node *)0x0;
    local_450 = 0;
    iVar28 = 0;
    ptr_00 = (stbrp_context *)0x0;
  }
  else {
    if ((local_450 < -0x7fff) || (0xffff < iVar63)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    if (iVar63 < 2) {
      uVar30 = 0;
    }
    else {
      uVar30 = 0;
      psVar12 = local_3d0;
      do {
        uVar30 = uVar30 + 1;
        psVar12->next = psVar12 + 1;
        psVar12 = psVar12 + 1;
      } while (iVar63 - 1 != uVar30);
      uVar30 = uVar30 & 0xffffffff;
    }
    local_3d0[uVar30].next = (stbrp_node *)0x0;
    ptr_00->init_mode = 1;
    ptr_00->heuristic = 0;
    ptr_00->free_head = local_3d0;
    ptr_00->active_head = ptr_00->extra;
    ptr_00->width = iVar63;
    ptr_00->height = 0x8000 - local_450;
    ptr_00->num_nodes = iVar63;
    ptr_00->align = (iVar63 * 2 + -1) / iVar63;
    ptr_00->extra[0].x = 0;
    ptr_00->extra[0].y = 0;
    ptr_00->extra[0].next = ptr_00->extra + 1;
    ptr_00->extra[1].x = (stbrp_coord)iVar63;
    ptr_00->extra[1].y = 0xffff;
    ptr_00->extra[1].next = (stbrp_node *)0x0;
  }
  local_2e8 = ptr_00;
  ImFontAtlasBuildPackCustomRects(atlas,ptr_00);
  if (0 < (int)uVar6) {
    lVar69 = 0;
    pvVar33 = __s;
    do {
      lVar59 = lVar69 * 0x110;
      iVar63 = *(int *)((long)pvVar33 + lVar59 + 0xe8);
      __s = pvVar33;
      if (iVar63 != 0) {
        stbrp_pack_rects(local_2e8,*(stbrp_rect **)((long)pvVar33 + lVar59 + 200),iVar63);
        lVar50 = (long)*(int *)((long)pvVar33 + lVar59 + 0xe8);
        if (0 < lVar50) {
          lVar59 = *(long *)((long)pvVar33 + lVar59 + 200);
          lVar49 = 0;
          do {
            if (*(int *)(lVar59 + 0xc + lVar49) != 0) {
              iVar63 = (uint)*(ushort *)(lVar59 + 6 + lVar49) +
                       (uint)*(ushort *)(lVar59 + 10 + lVar49);
              if (iVar63 < atlas->TexHeight) {
                iVar63 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar63;
            }
            lVar49 = lVar49 + 0x10;
          } while (lVar50 * 0x10 != lVar49);
        }
      }
      lVar69 = lVar69 + 1;
      pvVar33 = __s;
    } while (lVar69 != lVar41);
  }
  uVar27 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar27 = (int)(uVar27 - 1) >> 1 | uVar27 - 1;
    uVar27 = (int)uVar27 >> 2 | uVar27;
    uVar27 = (int)uVar27 >> 4 | uVar27;
    uVar27 = (int)uVar27 >> 8 | uVar27;
    uVar27 = (int)uVar27 >> 0x10 | uVar27;
  }
  iVar29 = uVar27 + 1;
  atlas->TexHeight = iVar29;
  iVar63 = atlas->TexWidth;
  (atlas->TexUvScale).x = 1.0 / (float)iVar63;
  (atlas->TexUvScale).y = 1.0 / (float)iVar29;
  puVar34 = (uchar *)ImGui::MemAlloc((long)(iVar29 * iVar63));
  atlas->TexPixelsAlpha8 = puVar34;
  memset(puVar34,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (0 < (int)uVar6) {
    local_358 = atlas->TexPixelsAlpha8;
    lVar59 = (long)iVar28;
    lVar50 = 0;
    local_310 = iVar28;
    lVar69 = lVar59;
    do {
      local_370 = lVar50;
      if ((atlas->ConfigData).Size <= lVar50) goto LAB_0015cd67;
      if (*(int *)((long)__s + lVar50 * 0x110 + 0xe8) != 0) {
        psVar67 = (stbtt_fontinfo *)(lVar50 * 0x110 + (long)__s);
        local_2d8 = *(float *)&psVar67[1].userdata;
        local_390 = psVar67;
        if (local_2d8 <= 0.0) {
          uStack_2d4 = 0x80000000;
          uStack_2d0 = 0x80000000;
          uStack_2cc = 0x80000000;
          local_2d8 = -local_2d8;
          uVar27 = (uint)(ushort)(*(ushort *)(psVar67->data + (long)psVar67->head + 0x12) << 8 |
                                 *(ushort *)(psVar67->data + (long)psVar67->head + 0x12) >> 8);
        }
        else {
          puVar34 = psVar67->data;
          lVar50 = (long)psVar67->hhea;
          uVar27 = ((int)(short)((ushort)puVar34[lVar50 + 4] << 8) | (uint)puVar34[lVar50 + 5]) -
                   ((int)(short)((ushort)puVar34[lVar50 + 6] << 8) | (uint)puVar34[lVar50 + 7]);
          uStack_2d4 = 0;
          uStack_2d0 = 0;
          uStack_2cc = 0;
        }
        local_2d8 = local_2d8 / (float)(int)uVar27;
        bVar66 = (byte)psVar67[1].glyf;
        fVar71 = (float)bVar66;
        local_37c = 0.0;
        local_380 = 0.0;
        local_410 = (ulong)bVar66;
        uVar30 = local_410;
        local_410._0_4_ = (uint)bVar66;
        if (bVar66 != 0) {
          local_380 = (float)(int)(1 - (uint)local_410) / (fVar71 + fVar71);
        }
        bVar3 = *(byte *)((long)&psVar67[1].glyf + 1);
        fVar78 = (float)bVar3;
        if (bVar3 != 0) {
          local_37c = (float)(int)(1 - (uint)bVar3) / (fVar78 + fVar78);
        }
        local_2b8 = (atlas->ConfigData).Data;
        local_410 = uVar30;
        if (0 < psVar67[1].fontstart) {
          lVar50._0_4_ = psVar67[1].hmtx;
          lVar50._4_4_ = psVar67[1].kern;
          fVar75 = 1.0 / fVar71;
          local_31c = fVar75;
          local_320 = 1.0 / fVar78;
          local_3b4 = fVar71 * local_2d8;
          fVar78 = fVar78 * local_2d8;
          fVar71 = fVar78;
          if (local_3b4 <= fVar78) {
            fVar71 = local_3b4;
          }
          local_374 = (0.35 / fVar71) * (0.35 / fVar71);
          local_268 = ZEXT416((uint)fVar78);
          fVar78 = -fVar78;
          local_48 = fVar78;
          uStack_44 = 0x80000000;
          uStack_40 = 0x80000000;
          uStack_3c = 0x80000000;
          local_290 = (ulong)bVar66;
          local_298 = (ulong)(uint)bVar3;
          local_408 = (ulong)bVar3;
          lVar49 = 0;
          local_2b0 = lVar50;
          do {
            if (((*(int *)(lVar50 + 0xc + lVar49 * 0x10) != 0) &&
                (lVar35 = lVar49 * 0x10 + lVar50, *(short *)(lVar35 + 4) != 0)) &&
               (*(short *)(lVar35 + 6) != 0)) {
              if (psVar67[1].data == (uchar *)0x0) {
                iVar28 = *(int *)((long)&psVar67[1].userdata + 4) + (int)lVar49;
              }
              else {
                iVar28 = *(int *)(psVar67[1].data + lVar49 * 4);
              }
              local_2a8 = (short *)(lVar49 * 0x1c + *(long *)&psVar67[1].loca);
              local_368 = lVar35;
              local_2a0 = lVar49;
              iVar63 = stbtt_FindGlyphIndex(psVar67,iVar28);
              lVar35 = local_368;
              sVar39 = (short)local_450;
              *(short *)(local_368 + 8) = *(short *)(local_368 + 8) + sVar39;
              *(short *)(local_368 + 10) = *(short *)(local_368 + 10) + sVar39;
              *(short *)(local_368 + 4) = *(short *)(local_368 + 4) - sVar39;
              *(short *)(local_368 + 6) = *(short *)(local_368 + 6) - sVar39;
              puVar34 = psVar67->data;
              uVar18 = *(ushort *)(puVar34 + (long)psVar67->hhea + 0x22) << 8 |
                       *(ushort *)(puVar34 + (long)psVar67->hhea + 0x22) >> 8;
              iVar28 = psVar67->hmtx;
              lVar50 = (ulong)uVar18 * 4 + (long)iVar28 + -4;
              lVar49 = (ulong)uVar18 * 4 + (long)iVar28 + -3;
              if (iVar63 < (int)(uint)uVar18) {
                lVar50 = (long)(iVar63 * 4) + (long)iVar28;
                lVar49 = (long)(iVar63 * 4) + 1 + (long)iVar28;
              }
              local_314 = (uint)puVar34[lVar50];
              local_318 = (uint)puVar34[lVar49];
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar67,iVar63,local_3b4,(float)local_268._0_4_,fVar75,fVar78,&local_300,
                         &local_304,&local_26c,&local_270);
              uVar64 = (uint)*(ushort *)(lVar35 + 8);
              uVar73 = 0;
              local_348 = (uchar *)(ulong)*(ushort *)(lVar35 + 10);
              local_3c8 = (ulong)*(ushort *)(lVar35 + 4);
              local_360 = (ulong)*(ushort *)(lVar35 + 6);
              uVar27 = stbtt_GetGlyphShape(psVar67,iVar63,(stbtt_vertex **)&local_3c0);
              uVar30 = local_408;
              uVar53 = ((int)local_3c8 - (int)local_410) + 1;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (local_390,iVar63,local_3b4,(float)local_268._0_4_,fVar75,fVar78,
                         (int *)&local_44c,&local_2fc,(int *)0x0,(int *)0x0);
              sVar26 = local_44c;
              local_3ac = uVar53;
              if (uVar53 != 0) {
                iVar28 = ((int)local_360 - (int)uVar30) + 1;
                local_3a8._0_4_ = iVar28;
                if (iVar28 != 0) {
                  lVar50 = CONCAT44(local_3c0._4_4_,(stbtt_uint32)local_3c0);
                  local_258[0].data = (uchar *)((ulong)local_258[0].data & 0xffffffff00000000);
                  if ((int)uVar27 < 1) {
                    uVar42 = 0;
                  }
                  else {
                    lVar49 = 0;
                    uVar42 = 0;
                    do {
                      uVar42 = (ulong)((int)uVar42 +
                                      (uint)(*(char *)(lVar50 + 0xc + lVar49) == '\x01'));
                      lVar49 = lVar49 + 0xe;
                    } while ((ulong)uVar27 * 0xe != lVar49);
                  }
                  local_378 = local_2fc;
                  if ((int)uVar42 == 0) {
LAB_0015b3ec:
                    local_448 = (void *)0x0;
LAB_0015b3f5:
                    points = (stbtt__point *)0x0;
                  }
                  else {
                    local_448 = ImGui::MemAlloc((long)(int)uVar42 << 2);
                    if (local_448 == (void *)0x0) {
                      uVar42 = 0;
                      goto LAB_0015b3f5;
                    }
                    uVar56 = 0;
                    iVar28 = 0;
                    points = (stbtt__point *)0x0;
                    do {
                      local_428._0_8_ = uVar56;
                      if ((int)uVar56 == 0) {
LAB_0015b1ae:
                        local_258[0].data = (uchar *)((ulong)local_258[0].data & 0xffffffff00000000)
                        ;
                        if ((int)uVar27 < 1) {
                          lVar49 = -1;
                        }
                        else {
                          uVar53 = 0xffffffff;
                          fVar78 = 0.0;
                          lVar49 = 0;
                          fVar71 = 0.0;
                          lVar59 = lVar69;
                          do {
                            puVar34 = local_258[0].data;
                            switch(*(undefined1 *)(lVar50 + 0xc + lVar49)) {
                            case 1:
                              if (-1 < (int)uVar53) {
                                *(int *)((long)local_448 + (ulong)uVar53 * 4) =
                                     (int)local_258[0].data - iVar28;
                              }
                              uVar53 = uVar53 + 1;
                              sVar39 = *(short *)(lVar50 + lVar49);
                              sVar19 = *(short *)(lVar50 + 2 + lVar49);
                              iVar28 = (int)local_258[0].data;
                              break;
                            case 2:
                              sVar39 = *(short *)(lVar50 + lVar49);
                              sVar19 = *(short *)(lVar50 + 2 + lVar49);
                              break;
                            case 3:
                              stbtt__tesselate_curve
                                        (points,(int *)local_258,fVar71,fVar78,
                                         (float)(int)*(short *)(lVar50 + 4 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 6 + lVar49),
                                         (float)(int)*(short *)(lVar50 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 2 + lVar49),local_374,0);
                              goto LAB_0015b313;
                            case 4:
                              stbtt__tesselate_cubic
                                        (points,(int *)local_258,fVar71,fVar78,
                                         (float)(int)*(short *)(lVar50 + 4 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 6 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 8 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 10 + lVar49),
                                         (float)(int)*(short *)(lVar50 + lVar49),
                                         (float)(int)*(short *)(lVar50 + 2 + lVar49),local_374,0);
LAB_0015b313:
                              fVar71 = (float)(int)*(short *)(lVar50 + lVar49);
                              fVar78 = (float)(int)*(short *)(lVar50 + 2 + lVar49);
                              puVar34 = local_258[0].data;
                            default:
                              goto switchD_0015b1f2_default;
                            }
                            puVar34 = (uchar *)CONCAT44(local_258[0].data._4_4_,
                                                        (int)local_258[0].data + 1);
                            fVar78 = (float)(int)sVar19;
                            fVar71 = (float)(int)sVar39;
                            if (points != (stbtt__point *)0x0) {
                              points[(int)local_258[0].data].x = fVar71;
                              points[(int)local_258[0].data].y = fVar78;
                            }
switchD_0015b1f2_default:
                            local_258[0].data = puVar34;
                            lVar49 = lVar49 + 0xe;
                          } while ((ulong)uVar27 * 0xe != lVar49);
                          lVar49 = (long)(int)uVar53;
                          uVar30 = local_408;
                          lVar69 = lVar59;
                        }
                        *(int *)((long)local_448 + lVar49 * 4) = (int)local_258[0].data - iVar28;
                        bVar17 = true;
                      }
                      else {
                        points = (stbtt__point *)ImGui::MemAlloc((long)(int)local_258[0].data << 3);
                        if (points != (stbtt__point *)0x0) goto LAB_0015b1ae;
                        points = (stbtt__point *)0x0;
                        bVar17 = false;
                      }
                      if (!bVar17) {
                        ImGui::MemFree(points);
                        ImGui::MemFree(local_448);
                        uVar42 = 0;
                        goto LAB_0015b3ec;
                      }
                      uVar56 = (ulong)(local_428._0_4_ + 1);
                    } while (local_428._0_4_ == 0);
                  }
                  local_350 = points;
                  if (points != (stbtt__point *)0x0) {
                    if ((int)uVar42 < 1) {
                      size = 0x14;
                    }
                    else {
                      uVar56 = 0;
                      lVar50 = 0;
                      do {
                        lVar50 = (long)(int)lVar50 + (long)*(int *)((long)local_448 + uVar56 * 4);
                        uVar56 = uVar56 + 1;
                      } while (uVar42 != uVar56);
                      size = lVar50 * 0x14 + 0x14;
                    }
                    p_00 = (stbtt__edge *)ImGui::MemAlloc(size);
                    if (p_00 != (stbtt__edge *)0x0) {
                      if ((int)uVar42 < 1) {
                        uVar56 = 0;
                      }
                      else {
                        uVar45 = 0;
                        uVar56 = 0;
                        iVar28 = 0;
                        do {
                          iVar63 = *(int *)((long)local_448 + uVar45 * 4);
                          if (0 < iVar63) {
                            uVar62 = (ulong)(iVar63 - 1);
                            uVar60 = 0;
                            do {
                              iVar29 = (int)uVar62;
                              fVar71 = local_350[(long)iVar28 + (long)iVar29].y;
                              fVar78 = local_350[(long)iVar28 + uVar60].y;
                              if ((fVar71 != fVar78) || (NAN(fVar71) || NAN(fVar78))) {
                                iVar61 = (int)uVar60;
                                iVar40 = iVar29;
                                if (fVar71 <= fVar78) {
                                  iVar40 = iVar61;
                                  iVar61 = iVar29;
                                }
                                iVar29 = (int)uVar56;
                                p_00[iVar29].invert = (uint)(fVar78 < fVar71);
                                p_00[iVar29].x0 =
                                     local_350[(long)iVar28 + (long)iVar40].x * local_3b4 + 0.0;
                                p_00[iVar29].y0 =
                                     local_350[(long)iVar28 + (long)iVar40].y * local_48 + 0.0;
                                p_00[iVar29].x1 =
                                     local_350[(long)iVar28 + (long)iVar61].x * local_3b4 + 0.0;
                                p_00[iVar29].y1 =
                                     local_350[(long)iVar28 + (long)iVar61].y * local_48 + 0.0;
                                uVar56 = (ulong)(iVar29 + 1);
                                lVar59 = lVar69;
                              }
                              uVar62 = uVar60 & 0xffffffff;
                              uVar60 = uVar60 + 1;
                              uVar30 = local_408;
                            } while ((long)uVar60 < (long)*(int *)((long)local_448 + uVar45 * 4));
                          }
                          iVar28 = iVar28 + iVar63;
                          uVar45 = uVar45 + 1;
                        } while (uVar45 != uVar42);
                      }
                      iVar28 = (int)uVar56;
                      stbtt__sort_edges_quicksort(p_00,iVar28);
                      if (1 < iVar28) {
                        uVar42 = 1;
                        do {
                          fVar71 = p_00[uVar42].x0;
                          fVar78 = p_00[uVar42].y0;
                          iVar63 = p_00[uVar42].invert;
                          local_258[0].cursor = iVar63;
                          local_258[0].data = *(uchar **)&p_00[uVar42].x1;
                          uVar45 = uVar42 & 0xffffffff;
                          do {
                            uVar27 = (uint)uVar45;
                            if ((int)uVar27 < 1) break;
                            fVar75 = p_00[uVar45 - 1].y0;
                            if (fVar78 < fVar75) {
                              psVar65 = p_00 + uVar45;
                              psVar65->invert = psVar65[-1].invert;
                              fVar72 = psVar65[-1].y0;
                              fVar77 = psVar65[-1].x1;
                              fVar74 = psVar65[-1].y1;
                              psVar65->x0 = psVar65[-1].x0;
                              psVar65->y0 = fVar72;
                              psVar65->x1 = fVar77;
                              psVar65->y1 = fVar74;
                              uVar45 = (ulong)(uVar27 - 1);
                            }
                            uVar27 = (uint)uVar45;
                          } while (fVar78 < fVar75);
                          if (uVar42 != uVar27) {
                            p_00[(int)uVar27].x0 = fVar71;
                            p_00[(int)uVar27].y0 = fVar78;
                            *(uchar **)&p_00[(int)uVar27].x1 = local_258[0].data;
                            p_00[(int)uVar27].invert = iVar63;
                          }
                          uVar42 = uVar42 + 1;
                        } while (uVar42 != uVar56);
                      }
                      uVar27 = (int)local_3c8 - (int)local_410;
                      local_3c8 = (ulong)uVar27;
                      local_440 = (undefined1  [8])0x0;
                      scanline = local_258;
                      if (0x3f < (int)uVar27) {
                        scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)local_3ac * 8 + 4);
                      }
                      uVar27 = (int)local_360 - (int)uVar30;
                      local_360 = (ulong)uVar27;
                      p_00[iVar28].y0 = (float)(local_3a8._0_4_ + local_378) + 1.0;
                      if (uVar27 < 0x7fffffff) {
                        local_348 = local_358 + (long)local_348 * lVar59 + CONCAT44(uVar73,uVar64);
                        local_308 = (float)(int)sVar26;
                        local_288 = (long)(int)local_3ac;
                        local_330 = (float *)((long)&scanline->data + local_288 * 4);
                        local_2e0 = local_330 + 1;
                        local_278 = local_288 * 4;
                        local_3b0 = (float)(int)local_3ac;
                        local_280 = (long)(int)(uint)local_3c8 * 4 + 8;
                        local_340 = 0;
                        local_338 = 0;
                        local_388 = (undefined8 *)0x0;
                        local_3fc = 0;
                        local_3f0 = (stbtt__active_edge *)0x0;
                        psVar65 = p_00;
                        iVar28 = local_378;
                        do {
                          fVar71 = (float)iVar28;
                          fVar78 = fVar71 + 1.0;
                          local_30c = iVar28;
                          memset(scanline,0,local_278);
                          memset(local_330,0,local_280);
                          psVar68 = local_3f0;
                          if (local_440 != (undefined1  [8])0x0) {
                            auVar37 = local_440;
                            psVar46 = (stbtt__active_edge *)local_440;
                            do {
                              psVar47 = (stbtt__active_edge *)auVar37;
                              if (((stbtt__active_edge *)auVar37)->ey <= fVar71) {
                                psVar46->next = ((stbtt__active_edge *)auVar37)->next;
                                if ((((stbtt__active_edge *)auVar37)->direction == 0.0) &&
                                   (!NAN(((stbtt__active_edge *)auVar37)->direction))) {
                                  __assert_fail("z->direction",
                                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                ,0xc63,
                                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                               );
                                }
                                ((stbtt__active_edge *)auVar37)->direction = 0.0;
                                ((stbtt__active_edge *)auVar37)->next = psVar68;
                                psVar47 = psVar46;
                                psVar68 = (stbtt__active_edge *)auVar37;
                              }
                              auVar37 = (undefined1  [8])psVar47->next;
                              psVar46 = psVar47;
                            } while (auVar37 != (undefined1  [8])0x0);
                          }
                          fVar75 = psVar65->y0;
                          if (fVar75 <= fVar78) {
                            bVar17 = local_378 != 0;
                            bVar70 = (int)local_338 == 0;
                            do {
                              if ((fVar75 != psVar65->y1) || (NAN(fVar75) || NAN(psVar65->y1))) {
                                if (psVar68 == (stbtt__active_edge *)0x0) {
                                  if (local_3fc == 0) {
                                    puVar38 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                    if (puVar38 == (undefined8 *)0x0) {
                                      local_3f0 = psVar68;
                                      psVar68 = (stbtt__active_edge *)0x0;
                                      goto LAB_0015bf96;
                                    }
                                    *puVar38 = local_388;
                                    local_3fc = 800;
                                    local_388 = puVar38;
                                  }
                                  lVar59 = (long)local_3fc;
                                  local_3fc = local_3fc + -1;
                                  local_3f0 = psVar68;
                                  psVar68 = (stbtt__active_edge *)(local_388 + lVar59 * 4 + -3);
                                }
                                else {
                                  local_3f0 = psVar68->next;
                                }
LAB_0015bf96:
                                if (psVar68 == (stbtt__active_edge *)0x0) {
                                  __assert_fail("z != __null",
                                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                ,0xad1,
                                                "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                               );
                                }
                                fVar75 = psVar65->x0;
                                fVar72 = psVar65->y0;
                                fVar77 = psVar65->y1;
                                fVar74 = (psVar65->x1 - fVar75) / (fVar77 - fVar72);
                                psVar68->fdx = fVar74;
                                psVar68->fdy = (float)(-(uint)(fVar74 != 0.0) & (uint)(1.0 / fVar74)
                                                      );
                                psVar68->fx = ((fVar71 - fVar72) * fVar74 + fVar75) - local_308;
                                psVar68->direction =
                                     *(float *)(&DAT_001aaae8 + (ulong)(psVar65->invert == 0) * 4);
                                psVar68->sy = fVar72;
                                psVar68->ey = fVar77;
                                psVar68->next = (stbtt__active_edge *)0x0;
                                if (fVar77 < fVar71 && (bVar70 && bVar17)) {
                                  psVar68->ey = fVar71;
                                }
                                if (psVar68->ey < fVar71) {
                                  __assert_fail("z->ey >= scan_y_top",
                                                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                ,0xc76,
                                                "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                               );
                                }
                                psVar68->next = (stbtt__active_edge *)local_440;
                                local_440 = (undefined1  [8])psVar68;
                              }
                              else {
                                local_3f0 = psVar68;
                              }
                              fVar75 = psVar65[1].y0;
                              psVar65 = psVar65 + 1;
                              psVar68 = local_3f0;
                              auVar37 = local_440;
                            } while (fVar75 <= fVar78);
                          }
                          else {
                            local_3f0 = psVar68;
                            auVar37 = local_440;
                          }
                          for (; auVar37 != (undefined1  [8])0x0;
                              auVar37 = (undefined1  [8])((stbtt__active_edge *)auVar37)->next) {
                            fVar75 = ((stbtt__active_edge *)auVar37)->ey;
                            if (fVar75 < fVar71) {
                              __assert_fail("e->ey >= y_top",
                                            "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                            ,0xba5,
                                            "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                           );
                            }
                            fVar72 = ((stbtt__active_edge *)auVar37)->fx;
                            fVar77 = ((stbtt__active_edge *)auVar37)->fdx;
                            if ((fVar77 != 0.0) || (NAN(fVar77))) {
                              fVar74 = ((stbtt__active_edge *)auVar37)->sy;
                              if (fVar78 < fVar74) {
                                __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                              "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                              ,3000,
                                              "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                             );
                              }
                              fVar81 = fVar77 + fVar72;
                              fVar76 = (float)(~-(uint)(fVar71 < fVar74) & (uint)fVar72 |
                                              (uint)((fVar74 - fVar71) * fVar77 + fVar72) &
                                              -(uint)(fVar71 < fVar74));
                              if ((((fVar76 < 0.0) ||
                                   (fVar80 = (float)(~-(uint)(fVar75 < fVar78) & (uint)fVar81 |
                                                    (uint)((fVar75 - fVar71) * fVar77 + fVar72) &
                                                    -(uint)(fVar75 < fVar78)), fVar80 < 0.0)) ||
                                  (local_3b0 <= fVar76)) || (local_3b0 <= fVar80)) {
                                if ((uint)local_3c8 < 0x7fffffff) {
                                  local_2f8 = ZEXT416((uint)fVar72);
                                  local_3a8 = ZEXT416((uint)fVar81);
                                  local_328 = CONCAT44(local_328._4_4_,fVar77);
                                  uVar27 = 0;
                                  do {
                                    fVar75 = (float)(int)uVar27;
                                    uVar53 = uVar27 + 1;
                                    fVar76 = (float)(int)uVar53;
                                    fVar74 = (fVar75 - fVar72) / fVar77 + fVar71;
                                    fVar77 = (fVar76 - fVar72) / fVar77 + fVar71;
                                    local_428._0_4_ = fVar75;
                                    if ((fVar75 <= fVar72) || (fVar81 <= fVar76)) {
                                      if ((fVar81 < fVar75) && (fVar76 < fVar72)) {
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar27,
                                                   (stbtt__active_edge *)auVar37,fVar72,fVar71,
                                                   fVar76,fVar77);
                                        fVar72 = fVar76;
                                        fVar80 = fVar77;
                                        fVar75 = (float)local_428._0_4_;
LAB_0015bb5c:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar27,
                                                   (stbtt__active_edge *)auVar37,fVar72,fVar80,
                                                   fVar75,fVar74);
                                        fVar72 = (float)local_428._0_4_;
                                        goto LAB_0015bb78;
                                      }
                                      fVar80 = fVar71;
                                      if (((fVar72 < fVar75) && (fVar75 < fVar81)) ||
                                         ((fVar81 < fVar75 && (fVar75 < fVar72))))
                                      goto LAB_0015bb5c;
                                      fVar75 = fVar71;
                                      fVar74 = fVar77;
                                      if (((fVar72 < fVar76) && (fVar76 < fVar81)) ||
                                         ((fVar81 < fVar76 && (fVar76 < fVar72))))
                                      goto LAB_0015bacb;
                                    }
                                    else {
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar27,
                                                 (stbtt__active_edge *)auVar37,fVar72,fVar71,fVar75,
                                                 fVar74);
                                      fVar72 = (float)local_428._0_4_;
                                      fVar75 = fVar74;
                                      fVar74 = fVar77;
LAB_0015bacb:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar27,
                                                 (stbtt__active_edge *)auVar37,fVar72,fVar75,fVar76,
                                                 fVar74);
                                      fVar72 = fVar76;
LAB_0015bb78:
                                      fVar75 = fVar74;
                                      fVar81 = (float)local_3a8._0_4_;
                                    }
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,uVar27,
                                               (stbtt__active_edge *)auVar37,fVar72,fVar75,fVar81,
                                               fVar78);
                                    fVar77 = (float)local_328;
                                    fVar72 = (float)local_2f8._0_4_;
                                    fVar81 = (float)local_3a8._0_4_;
                                    uVar27 = uVar53;
                                  } while (local_3ac != uVar53);
                                }
                              }
                              else {
                                if (fVar74 <= fVar71) {
                                  fVar74 = fVar71;
                                }
                                uVar27 = (uint)fVar76;
                                if (fVar78 <= fVar75) {
                                  fVar75 = fVar78;
                                }
                                if (uVar27 == (int)fVar80) {
                                  if (((int)uVar27 < 0) || ((int)(uint)local_3c8 < (int)uVar27)) {
                                    __assert_fail("x >= 0 && x < len",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar30 = (ulong)uVar27;
                                  *(float *)((long)&scanline->data + uVar30 * 4) =
                                       (((fVar80 - (float)(int)uVar27) +
                                        (fVar76 - (float)(int)uVar27)) * -0.5 + 1.0) *
                                       ((stbtt__active_edge *)auVar37)->direction *
                                       (fVar75 - fVar74) +
                                       *(float *)((long)&scanline->data + uVar30 * 4);
                                  fVar72 = (fVar75 - fVar74) *
                                           ((stbtt__active_edge *)auVar37)->direction;
                                }
                                else {
                                  fVar77 = ((stbtt__active_edge *)auVar37)->fdy;
                                  fVar79 = fVar80;
                                  if (fVar80 < fVar76) {
                                    fVar72 = fVar71 - fVar74;
                                    fVar74 = (fVar71 - fVar75) + fVar78;
                                    fVar77 = -fVar77;
                                    fVar75 = fVar72 + fVar78;
                                    fVar79 = fVar76;
                                    fVar72 = fVar81;
                                    fVar76 = fVar80;
                                  }
                                  iVar63 = (int)fVar79;
                                  iVar28 = (int)fVar76 + 1;
                                  fVar80 = ((float)iVar28 - fVar72) * fVar77 + fVar71;
                                  fVar72 = ((stbtt__active_edge *)auVar37)->direction;
                                  fVar81 = (fVar80 - fVar74) * fVar72;
                                  lVar59 = (long)(int)fVar76;
                                  *(float *)((long)&scanline->data + lVar59 * 4) =
                                       (((fVar76 - (float)(int)fVar76) + 1.0) * -0.5 + 1.0) * fVar81
                                       + *(float *)((long)&scanline->data + lVar59 * 4);
                                  if (iVar63 - iVar28 != 0 && iVar28 <= iVar63) {
                                    do {
                                      *(float *)((long)&scanline->data + lVar59 * 4 + 4) =
                                           fVar77 * fVar72 * 0.5 + fVar81 +
                                           *(float *)((long)&scanline->data + lVar59 * 4 + 4);
                                      fVar81 = fVar81 + fVar77 * fVar72;
                                      lVar59 = lVar59 + 1;
                                    } while (iVar63 + -1 != (int)lVar59);
                                  }
                                  if (1.01 < ABS(fVar81)) {
                                    __assert_fail("fabsf(area) <= 1.01f",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  uVar30 = (ulong)iVar63;
                                  *(float *)((long)&scanline->data + uVar30 * 4) =
                                       (fVar75 - (fVar77 * (float)(iVar63 - iVar28) + fVar80)) *
                                       (((fVar79 - (float)iVar63) + 0.0) * -0.5 + 1.0) * fVar72 +
                                       fVar81 + *(float *)((long)&scanline->data + uVar30 * 4);
                                  fVar72 = (fVar75 - fVar74) * fVar72;
                                }
                                local_2e0[uVar30] = fVar72 + local_2e0[uVar30];
                              }
                            }
                            else if (fVar72 < local_3b0) {
                              if (0.0 <= fVar72) {
                                local_2f8 = ZEXT416((uint)fVar72);
                                stbtt__handle_clipped_edge
                                          ((float *)scanline,(int)fVar72,
                                           (stbtt__active_edge *)auVar37,fVar72,fVar71,fVar72,fVar78
                                          );
                                iVar28 = (int)fVar72 + 1;
                                fVar72 = (float)local_2f8._0_4_;
                              }
                              else {
                                iVar28 = 0;
                              }
                              stbtt__handle_clipped_edge
                                        (local_330,iVar28,(stbtt__active_edge *)auVar37,fVar72,
                                         fVar71,fVar72,fVar78);
                            }
                          }
                          auVar37 = local_440;
                          if ((uint)local_3c8 < 0x7fffffff) {
                            fVar71 = 0.0;
                            psVar36 = scanline;
                            uVar30 = local_340;
                            lVar59 = local_288;
                            do {
                              fVar71 = fVar71 + *(float *)((long)&psVar36->data + local_288 * 4);
                              iVar28 = (int)(ABS(*(float *)&psVar36->data + fVar71) * 255.0 + 0.5);
                              uVar55 = (uchar)iVar28;
                              if (0xfe < iVar28) {
                                uVar55 = 0xff;
                              }
                              local_348[(int)uVar30] = uVar55;
                              uVar30 = (ulong)((int)uVar30 + 1);
                              psVar36 = (stbtt__buf *)((long)&psVar36->data + 4);
                              lVar59 = lVar59 + -1;
                            } while (lVar59 != 0);
                          }
                          for (; auVar37 != (undefined1  [8])0x0;
                              auVar37 = (undefined1  [8])((stbtt__active_edge *)auVar37)->next) {
                            ((stbtt__active_edge *)auVar37)->fx =
                                 ((stbtt__active_edge *)auVar37)->fdx +
                                 ((stbtt__active_edge *)auVar37)->fx;
                          }
                          iVar28 = local_30c + 1;
                          iVar63 = (int)local_338;
                          local_338 = (ulong)(iVar63 + 1);
                          local_340 = (ulong)(uint)((int)local_340 + local_310);
                          puVar38 = local_388;
                          lVar59 = lVar69;
                          uVar30 = local_408;
                        } while (iVar63 != (int)local_360);
                      }
                      else {
                        local_388 = (undefined8 *)0x0;
                        puVar38 = local_388;
                        lVar59 = lVar69;
                      }
                      while (puVar38 != (undefined8 *)0x0) {
                        puVar10 = (undefined8 *)*puVar38;
                        ImGui::MemFree(puVar38);
                        puVar38 = puVar10;
                      }
                      if (scanline != local_258) {
                        ImGui::MemFree(scanline);
                      }
                      ImGui::MemFree(p_00);
                    }
                    ImGui::MemFree(local_448);
                    ImGui::MemFree(local_350);
                  }
                }
              }
              bVar66 = (byte)uVar30;
              ImGui::MemFree((void *)CONCAT44(local_3c0._4_4_,(stbtt_uint32)local_3c0));
              if (1 < (byte)local_410) {
                uVar18 = *(ushort *)(local_368 + 4);
                uVar5 = *(ushort *)(local_368 + 6);
                local_258[0].data = (uchar *)0x0;
                lVar59 = lVar69;
                if (uVar5 != 0) {
                  puVar34 = local_358 +
                            (ulong)*(ushort *)(local_368 + 10) * lVar69 +
                            (ulong)*(ushort *)(local_368 + 8);
                  iVar28 = uVar18 - (uint)local_410;
                  uVar30 = (ulong)(iVar28 + 1);
                  uVar27 = 0;
                  do {
                    uVar42 = local_410;
                    memset(local_258,0,local_410);
                    switch((int)uVar42) {
                    case 2:
                      if (iVar28 < 0) {
LAB_0015c31c:
                        uVar56 = 0;
                        uVar42 = 0;
                      }
                      else {
                        uVar56 = 0;
                        uVar42 = 0;
                        do {
                          bVar66 = puVar34[uVar56];
                          bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                          *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 2 & 7)) =
                               bVar66;
                          uVar53 = (int)uVar42 + ((uint)bVar66 - (uint)bVar3);
                          uVar42 = (ulong)uVar53;
                          puVar34[uVar56] = (uchar)(uVar53 >> 1);
                          uVar56 = uVar56 + 1;
                        } while (uVar30 != uVar56);
                      }
                      break;
                    case 3:
                      if (iVar28 < 0) goto LAB_0015c31c;
                      uVar56 = 0;
                      uVar42 = 0;
                      do {
                        bVar66 = puVar34[uVar56];
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 3 & 7)) = bVar66
                        ;
                        uVar42 = (ulong)((int)uVar42 + ((uint)bVar66 - (uint)bVar3));
                        puVar34[uVar56] = (uchar)(uVar42 / 3);
                        uVar56 = uVar56 + 1;
                      } while (uVar30 != uVar56);
                      break;
                    case 4:
                      if (iVar28 < 0) goto LAB_0015c31c;
                      uVar56 = 0;
                      uVar42 = 0;
                      do {
                        bVar66 = puVar34[uVar56];
                        uVar45 = (ulong)((uint)uVar56 & 7);
                        bVar3 = *(byte *)((long)&local_258[0].data + uVar45);
                        *(byte *)((long)&local_258[0].data + (uVar45 ^ 4)) = bVar66;
                        uVar53 = (int)uVar42 + ((uint)bVar66 - (uint)bVar3);
                        uVar42 = (ulong)uVar53;
                        puVar34[uVar56] = (uchar)(uVar53 >> 2);
                        uVar56 = uVar56 + 1;
                      } while (uVar30 != uVar56);
                      break;
                    case 5:
                      if (iVar28 < 0) goto LAB_0015c31c;
                      uVar56 = 0;
                      uVar42 = 0;
                      do {
                        bVar66 = puVar34[uVar56];
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 5 & 7)) = bVar66
                        ;
                        uVar42 = (ulong)((int)uVar42 + ((uint)bVar66 - (uint)bVar3));
                        puVar34[uVar56] = (uchar)(uVar42 / 5);
                        uVar56 = uVar56 + 1;
                      } while (uVar30 != uVar56);
                      break;
                    default:
                      if (iVar28 < 0) goto LAB_0015c31c;
                      uVar56 = 0;
                      uVar42 = 0;
                      do {
                        bVar66 = puVar34[uVar56];
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data +
                                 (ulong)((int)local_290 + (uint)uVar56 & 7)) = bVar66;
                        uVar42 = (ulong)((int)uVar42 + ((uint)bVar66 - (uint)bVar3));
                        puVar34[uVar56] = (uchar)(uVar42 / (local_410 & 0xffffffff));
                        uVar56 = uVar56 + 1;
                      } while (uVar30 != uVar56);
                    }
                    if ((int)uVar56 < (int)(uint)uVar18) {
                      uVar56 = uVar56 & 0xffffffff;
                      do {
                        if (puVar34[uVar56] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar53 = (int)uVar42 -
                                 (uint)*(byte *)((long)&local_258[0].data +
                                                (ulong)((uint)uVar56 & 7));
                        uVar42 = (ulong)uVar53;
                        puVar34[uVar56] = (uchar)(uVar53 / (uint)local_410);
                        uVar56 = uVar56 + 1;
                      } while ((int)uVar56 < (int)(uint)uVar18);
                    }
                    puVar34 = puVar34 + lVar59;
                    uVar27 = uVar27 + 1;
                  } while (uVar27 != uVar5);
                }
                bVar66 = (byte)local_408;
                lVar69 = lVar59;
              }
              if (1 < bVar66) {
                uVar18 = *(ushort *)(local_368 + 4);
                uVar27 = (uint)*(ushort *)(local_368 + 6);
                local_258[0].data = (uchar *)0x0;
                lVar59 = lVar69;
                if (uVar18 != 0) {
                  pbVar52 = local_358 +
                            (ulong)*(ushort *)(local_368 + 10) * lVar69 +
                            (ulong)*(ushort *)(local_368 + 8);
                  iVar28 = uVar27 - (uint)local_408;
                  uVar30 = (ulong)(iVar28 + 1);
                  uVar53 = 0;
                  do {
                    uVar42 = local_408;
                    memset(local_258,0,local_408);
                    switch((int)uVar42) {
                    case 2:
                      if (iVar28 < 0) {
LAB_0015c5ba:
                        uVar56 = 0;
                        uVar42 = 0;
                      }
                      else {
                        uVar56 = 0;
                        uVar42 = 0;
                        pbVar57 = pbVar52;
                        do {
                          bVar66 = *pbVar57;
                          bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                          *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 2 & 7)) =
                               bVar66;
                          uVar64 = (int)uVar42 + ((uint)bVar66 - (uint)bVar3);
                          uVar42 = (ulong)uVar64;
                          *pbVar57 = (byte)(uVar64 >> 1);
                          uVar56 = uVar56 + 1;
                          pbVar57 = pbVar57 + lVar59;
                        } while (uVar30 != uVar56);
                      }
                      break;
                    case 3:
                      if (iVar28 < 0) goto LAB_0015c5ba;
                      uVar56 = 0;
                      uVar42 = 0;
                      pbVar57 = pbVar52;
                      do {
                        bVar66 = *pbVar57;
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 3 & 7)) = bVar66
                        ;
                        uVar42 = (ulong)((int)uVar42 + ((uint)bVar66 - (uint)bVar3));
                        *pbVar57 = (byte)(uVar42 / 3);
                        uVar56 = uVar56 + 1;
                        pbVar57 = pbVar57 + lVar59;
                      } while (uVar30 != uVar56);
                      break;
                    case 4:
                      if (iVar28 < 0) goto LAB_0015c5ba;
                      uVar56 = 0;
                      uVar42 = 0;
                      pbVar57 = pbVar52;
                      do {
                        bVar66 = *pbVar57;
                        uVar45 = (ulong)((uint)uVar56 & 7);
                        bVar3 = *(byte *)((long)&local_258[0].data + uVar45);
                        *(byte *)((long)&local_258[0].data + (uVar45 ^ 4)) = bVar66;
                        uVar64 = (int)uVar42 + ((uint)bVar66 - (uint)bVar3);
                        uVar42 = (ulong)uVar64;
                        *pbVar57 = (byte)(uVar64 >> 2);
                        uVar56 = uVar56 + 1;
                        pbVar57 = pbVar57 + lVar59;
                      } while (uVar30 != uVar56);
                      break;
                    case 5:
                      if (iVar28 < 0) goto LAB_0015c5ba;
                      uVar56 = 0;
                      uVar42 = 0;
                      pbVar57 = pbVar52;
                      do {
                        bVar66 = *pbVar57;
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 + 5 & 7)) = bVar66
                        ;
                        uVar42 = (ulong)((int)uVar42 + ((uint)bVar66 - (uint)bVar3));
                        *pbVar57 = (byte)(uVar42 / 5);
                        uVar56 = uVar56 + 1;
                        pbVar57 = pbVar57 + lVar59;
                      } while (uVar30 != uVar56);
                      break;
                    default:
                      if (iVar28 < 0) goto LAB_0015c5ba;
                      uVar56 = 0;
                      uVar42 = 0;
                      pbVar57 = pbVar52;
                      do {
                        bVar66 = *pbVar57;
                        bVar3 = *(byte *)((long)&local_258[0].data + (ulong)((uint)uVar56 & 7));
                        *(byte *)((long)&local_258[0].data +
                                 (ulong)((int)local_298 + (uint)uVar56 & 7)) = bVar66;
                        uVar42 = (ulong)((int)uVar42 + ((uint)bVar66 - (uint)bVar3));
                        *pbVar57 = (byte)(uVar42 / (local_408 & 0xffffffff));
                        uVar56 = uVar56 + 1;
                        pbVar57 = pbVar57 + lVar59;
                      } while (uVar30 != uVar56);
                    }
                    iVar63 = (int)uVar56;
                    iVar29 = uVar27 - iVar63;
                    if (iVar29 != 0 && iVar63 <= (int)uVar27) {
                      lVar69 = (long)iVar63;
                      pbVar57 = pbVar52 + lVar59 * lVar69;
                      do {
                        if (*pbVar57 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar64 = (int)uVar42 -
                                 (uint)*(byte *)((long)&local_258[0].data +
                                                (ulong)((uint)lVar69 & 7));
                        uVar42 = (ulong)uVar64;
                        *pbVar57 = (byte)(uVar64 / (uint)local_408);
                        lVar69 = lVar69 + 1;
                        pbVar57 = pbVar57 + lVar59;
                        iVar29 = iVar29 + -1;
                      } while (iVar29 != 0);
                    }
                    pbVar52 = pbVar52 + 1;
                    uVar53 = uVar53 + 1;
                    lVar69 = lVar59;
                  } while (uVar53 != uVar18);
                }
              }
              sVar19 = (short)*(undefined4 *)(local_368 + 8);
              *local_2a8 = sVar19;
              sVar39 = *(short *)(local_368 + 10);
              local_2a8[1] = sVar39;
              uVar18 = *(ushort *)(local_368 + 4);
              local_2a8[2] = sVar19 + uVar18;
              uVar5 = *(ushort *)(local_368 + 6);
              local_2a8[3] = sVar39 + uVar5;
              *(float *)(local_2a8 + 8) =
                   (float)(int)(short)((short)(local_314 << 8) + (short)local_318) * local_2d8;
              *(float *)(local_2a8 + 4) = (float)local_300 * local_31c + local_380;
              *(float *)(local_2a8 + 6) = (float)local_304 * local_320 + local_37c;
              *(float *)(local_2a8 + 10) =
                   (float)(int)(local_300 + (uint)uVar18) * local_31c + local_380;
              *(float *)(local_2a8 + 0xc) =
                   (float)(int)(local_304 + (uint)uVar5) * local_320 + local_37c;
              lVar49 = local_2a0;
              lVar50 = local_2b0;
              psVar67 = local_390;
              fVar75 = local_37c;
              fVar78 = local_380;
            }
            lVar49 = lVar49 + 1;
          } while (lVar49 < psVar67[1].fontstart);
        }
        fVar71 = local_2b8[local_370].RasterizerMultiply;
        if ((fVar71 != 1.0) || (NAN(fVar71))) {
          lVar50 = 0;
          do {
            uVar27 = (uint)(long)((float)(int)lVar50 * fVar71);
            if (0xfe < uVar27) {
              uVar27 = 0xff;
            }
            *(char *)((long)&local_258[0].data + lVar50) = (char)uVar27;
            lVar50 = lVar50 + 1;
          } while (lVar50 != 0x100);
          psVar67 = local_390;
          if (0 < local_390[1].cff.cursor) {
            lVar49._0_4_ = local_390[1].hmtx;
            lVar49._4_4_ = local_390[1].kern;
            iVar28 = 0;
            do {
              if ((*(int *)(lVar49 + 0xc) != 0) && (*(ushort *)(lVar49 + 6) != 0)) {
                uVar18 = *(ushort *)(lVar49 + 4);
                iVar63 = atlas->TexWidth;
                puVar34 = atlas->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar49 + 10) * (long)iVar63 +
                          (ulong)*(ushort *)(lVar49 + 8);
                uVar27 = (uint)*(ushort *)(lVar49 + 6);
                do {
                  if ((ulong)uVar18 != 0) {
                    uVar30 = 0;
                    do {
                      puVar34[uVar30] =
                           *(uchar *)((long)&local_258[0].data + (ulong)puVar34[uVar30]);
                      uVar30 = uVar30 + 1;
                    } while (uVar18 != uVar30);
                  }
                  puVar34 = puVar34 + iVar63;
                  bVar17 = 1 < (int)uVar27;
                  uVar27 = uVar27 - 1;
                } while (bVar17);
              }
              iVar28 = iVar28 + 1;
              lVar49 = lVar49 + 0x10;
            } while (iVar28 < local_390[1].cff.cursor);
          }
        }
        psVar67[1].hmtx = 0;
        psVar67[1].kern = 0;
      }
      lVar50 = local_370 + 1;
    } while (lVar50 != lVar41);
  }
  ImGui::MemFree(local_3d0);
  ImGui::MemFree(local_2e8);
  ptr = local_438._8_8_;
  if ((void *)local_438._8_8_ != (void *)0x0) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_438._8_8_;
    local_438 = auVar13 << 0x40;
    ImGui::MemFree((void *)ptr);
    local_438._8_8_ = 0;
  }
  if (0 < (int)uVar6) {
    lVar69 = 0;
    pvVar33 = __s;
    do {
      lVar59 = lVar69 * 0x110;
      __s = pvVar33;
      if (*(int *)((long)pvVar33 + lVar59 + 0xe8) != 0) {
        if ((atlas->ConfigData).Size <= lVar69) goto LAB_0015cd67;
        lVar50 = *(long *)((long)pvVar33 + lVar59 + 8);
        lVar49 = (long)*(int *)((long)pvVar33 + lVar59 + 0x24);
        uVar27 = (int)(short)((ushort)*(byte *)(lVar50 + 4 + lVar49) << 8) |
                 (uint)*(byte *)(lVar50 + 5 + lVar49);
        uVar73 = 0xbf800000;
        if (0 < (short)uVar27) {
          uVar73 = 0x3f800000;
        }
        local_428._0_4_ = uVar73;
        uVar53 = (int)(short)((ushort)*(byte *)(lVar50 + 6 + lVar49) << 8) |
                 (uint)*(byte *)(lVar50 + 7 + lVar49);
        local_468 = -1.0;
        if (0 < (short)uVar53) {
          local_468 = 1.0;
        }
        pIVar11 = (atlas->ConfigData).Data;
        pIVar58 = pIVar11 + lVar69;
        pIVar7 = pIVar11[lVar69].DstFont;
        if (pIVar11[lVar69].MergeMode == false) {
          fVar71 = pIVar11[lVar69].SizePixels;
          ImFont::ClearOutputData(pIVar7);
          fVar71 = fVar71 / (float)(int)(uVar27 - uVar53);
          pIVar7->FontSize = pIVar58->SizePixels;
          pIVar7->ConfigData = pIVar58;
          pIVar7->ConfigDataCount = 0;
          pIVar7->ContainerAtlas = atlas;
          pIVar7->Ascent = (float)(int)((float)(int)uVar27 * fVar71 + (float)local_428._0_4_);
          pIVar7->Descent = (float)(int)((float)(int)uVar53 * fVar71 + local_468);
        }
        pIVar7->ConfigDataCount = pIVar7->ConfigDataCount + 1;
        if (0 < *(int *)((long)pvVar33 + lVar59 + 0xe8)) {
          fVar71 = (pIVar58->GlyphOffset).x;
          local_428 = ZEXT416((uint)((float)(int)(pIVar7->Ascent + 0.5) + (pIVar58->GlyphOffset).y))
          ;
          lVar49 = 0;
          lVar50 = 0;
          do {
            if (*(int *)((long)pvVar33 + lVar59 + 0x100) <= lVar50) goto LAB_0015cceb;
            lVar35 = *(long *)((long)pvVar33 + lVar59 + 0xd0);
            fVar75 = 1.0 / (float)atlas->TexHeight;
            fVar78 = 1.0 / (float)atlas->TexWidth;
            ImFont::AddGlyph(pIVar7,pIVar58,
                             *(ImWchar *)(*(long *)((long)pvVar33 + lVar59 + 0x108) + lVar50 * 4),
                             *(float *)(lVar35 + 8 + lVar49) + 0.0 + fVar71,
                             *(float *)(lVar35 + 0xc + lVar49) + 0.0 + (float)local_428._0_4_,
                             *(float *)(lVar35 + 0x14 + lVar49) + 0.0 + fVar71,
                             *(float *)(lVar35 + 0x18 + lVar49) + 0.0 + (float)local_428._0_4_,
                             (float)*(ushort *)(lVar35 + lVar49) * fVar78,
                             (float)*(ushort *)(lVar35 + 2 + lVar49) * fVar75,
                             (float)*(ushort *)(lVar35 + 4 + lVar49) * fVar78,
                             (float)*(ushort *)(lVar35 + 6 + lVar49) * fVar75,
                             *(float *)(lVar35 + 0x10 + lVar49));
            lVar50 = lVar50 + 1;
            lVar49 = lVar49 + 0x1c;
          } while (lVar50 < *(int *)((long)pvVar33 + lVar59 + 0xe8));
        }
      }
      lVar69 = lVar69 + 1;
      pvVar33 = __s;
    } while (lVar69 != lVar41);
  }
  sVar16 = local_2c0;
  if (0 < (int)uVar6) {
    sVar51 = 0;
    do {
      pvVar33 = *(void **)((long)__s + sVar51 + 0x108);
      if (pvVar33 != (void *)0x0) {
        ImGui::MemFree(pvVar33);
      }
      pvVar33 = *(void **)((long)__s + sVar51 + 0xf8);
      if (pvVar33 != (void *)0x0) {
        ImGui::MemFree(pvVar33);
      }
      sVar51 = sVar51 + 0x110;
    } while (sVar16 != sVar51);
  }
  if (__s != (void *)0x0) {
    ImGui::MemFree(__s);
    __s = (void *)0x0;
  }
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_3e0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3e0);
  }
  if ((void *)local_438._8_8_ != (void *)0x0) {
    ImGui::MemFree((void *)local_438._8_8_);
  }
LAB_0015cbd9:
  bVar66 = (byte)((uint)uVar83 >> 0x18);
  if (local_3f8 != (void *)0x0) {
    ImGui::MemFree(local_3f8);
  }
  if (__s != (void *)0x0) {
    ImGui::MemFree(__s);
  }
  return (bool)(bVar66 & 1);
LAB_0015cd7e:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_0015cd00;
LAB_0015cd67:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_0015cd00;
LAB_0015cceb:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_0015cd00:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                ,0x706,__function);
}

Assistant:

static bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildInit(atlas);

    // Clear atlas
    atlas->TexID = (ImTextureID)NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Temporary storage for building
    ImVector<ImFontBuildSrcData> src_tmp_array;
    ImVector<ImFontBuildDstData> dst_tmp_array;
    src_tmp_array.resize(atlas->ConfigData.Size);
    dst_tmp_array.resize(atlas->Fonts.Size);
    memset(src_tmp_array.Data, 0, (size_t)src_tmp_array.size_in_bytes());
    memset(dst_tmp_array.Data, 0, (size_t)dst_tmp_array.size_in_bytes());

    // 1. Initialize font loading structure, check font data validity
    for (int src_i = 0; src_i < atlas->ConfigData.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        // Find index from cfg.DstFont (we allow the user to set cfg.DstFont. Also it makes casual debugging nicer than when storing indices)
        src_tmp.DstIndex = -1;
        for (int output_i = 0; output_i < atlas->Fonts.Size && src_tmp.DstIndex == -1; output_i++)
            if (cfg.DstFont == atlas->Fonts[output_i])
                src_tmp.DstIndex = output_i;
        if (src_tmp.DstIndex == -1)
        {
            IM_ASSERT(src_tmp.DstIndex != -1); // cfg.DstFont not pointing within atlas->Fonts[] array?
            return false;
        }
        // Initialize helper structure for font loading and verify that the TTF/OTF data is correct
        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&src_tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
            return false;

        // Measure highest codepoints
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.SrcRanges = cfg.GlyphRanges ? cfg.GlyphRanges : atlas->GetGlyphRangesDefault();
        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            src_tmp.GlyphsHighest = ImMax(src_tmp.GlyphsHighest, (int)src_range[1]);
        dst_tmp.SrcCount++;
        dst_tmp.GlyphsHighest = ImMax(dst_tmp.GlyphsHighest, src_tmp.GlyphsHighest);
    }

    // 2. For every requested codepoint, check for their presence in the font data, and handle redundancy or overlaps between source fonts to avoid unused glyphs.
    int total_glyphs_count = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        ImFontBuildDstData& dst_tmp = dst_tmp_array[src_tmp.DstIndex];
        src_tmp.GlyphsSet.Create(src_tmp.GlyphsHighest + 1);
        if (dst_tmp.GlyphsSet.Storage.empty())
            dst_tmp.GlyphsSet.Create(dst_tmp.GlyphsHighest + 1);

        for (const ImWchar* src_range = src_tmp.SrcRanges; src_range[0] && src_range[1]; src_range += 2)
            for (unsigned int codepoint = src_range[0]; codepoint <= src_range[1]; codepoint++)
            {
                if (dst_tmp.GlyphsSet.TestBit(codepoint))    // Don't overwrite existing glyphs. We could make this an option for MergeMode (e.g. MergeOverwrite==true)
                    continue;
                if (!stbtt_FindGlyphIndex(&src_tmp.FontInfo, codepoint))    // It is actually in the font?
                    continue;

                // Add to avail set/counters
                src_tmp.GlyphsCount++;
                dst_tmp.GlyphsCount++;
                src_tmp.GlyphsSet.SetBit(codepoint);
                dst_tmp.GlyphsSet.SetBit(codepoint);
                total_glyphs_count++;
            }
    }

    // 3. Unpack our bit map into a flat list (we now have all the Unicode points that we know are requested _and_ available _and_ not overlapping another)
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        src_tmp.GlyphsList.reserve(src_tmp.GlyphsCount);
        UnpackBitVectorToFlatIndexList(&src_tmp.GlyphsSet, &src_tmp.GlyphsList);
        src_tmp.GlyphsSet.Clear();
        IM_ASSERT(src_tmp.GlyphsList.Size == src_tmp.GlyphsCount);
    }
    for (int dst_i = 0; dst_i < dst_tmp_array.Size; dst_i++)
        dst_tmp_array[dst_i].GlyphsSet.Clear();
    dst_tmp_array.clear();

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    // (We technically don't need to zero-clear buf_rects, but let's do it for the sake of sanity)
    ImVector<stbrp_rect> buf_rects;
    ImVector<stbtt_packedchar> buf_packedchars;
    buf_rects.resize(total_glyphs_count);
    buf_packedchars.resize(total_glyphs_count);
    memset(buf_rects.Data, 0, (size_t)buf_rects.size_in_bytes());
    memset(buf_packedchars.Data, 0, (size_t)buf_packedchars.size_in_bytes());

    // 4. Gather glyphs sizes so we can pack them in our virtual canvas.
    int total_surface = 0;
    int buf_rects_out_n = 0;
    int buf_packedchars_out_n = 0;
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        src_tmp.Rects = &buf_rects[buf_rects_out_n];
        src_tmp.PackedChars = &buf_packedchars[buf_packedchars_out_n];
        buf_rects_out_n += src_tmp.GlyphsCount;
        buf_packedchars_out_n += src_tmp.GlyphsCount;

        // Convert our ranges in the format stb_truetype wants
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        src_tmp.PackRange.font_size = cfg.SizePixels;
        src_tmp.PackRange.first_unicode_codepoint_in_range = 0;
        src_tmp.PackRange.array_of_unicode_codepoints = src_tmp.GlyphsList.Data;
        src_tmp.PackRange.num_chars = src_tmp.GlyphsList.Size;
        src_tmp.PackRange.chardata_for_range = src_tmp.PackedChars;
        src_tmp.PackRange.h_oversample = (unsigned char)cfg.OversampleH;
        src_tmp.PackRange.v_oversample = (unsigned char)cfg.OversampleV;

        // Gather the sizes of all rectangles we will need to pack (this loop is based on stbtt_PackFontRangesGatherRects)
        const float scale = (cfg.SizePixels > 0) ? stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels) : stbtt_ScaleForMappingEmToPixels(&src_tmp.FontInfo, -cfg.SizePixels);
        const int padding = atlas->TexGlyphPadding;
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsList.Size; glyph_i++)
        {
            int x0, y0, x1, y1;
            const int glyph_index_in_font = stbtt_FindGlyphIndex(&src_tmp.FontInfo, src_tmp.GlyphsList[glyph_i]);
            IM_ASSERT(glyph_index_in_font != 0);
            stbtt_GetGlyphBitmapBoxSubpixel(&src_tmp.FontInfo, glyph_index_in_font, scale * cfg.OversampleH, scale * cfg.OversampleV, 0, 0, &x0, &y0, &x1, &y1);
            src_tmp.Rects[glyph_i].w = (stbrp_coord)(x1 - x0 + padding + cfg.OversampleH - 1);
            src_tmp.Rects[glyph_i].h = (stbrp_coord)(y1 - y0 + padding + cfg.OversampleV - 1);
            total_surface += src_tmp.Rects[glyph_i].w * src_tmp.Rects[glyph_i].h;
        }
    }

    // We need a width for the skyline algorithm, any width!
    // The exact width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    // User can override TexDesiredWidth and TexGlyphPadding if they wish, otherwise we use a simple heuristic to select the width based on expected surface.
    const int surface_sqrt = (int)ImSqrt((float)total_surface) + 1;
    atlas->TexHeight = 0;
    if (atlas->TexDesiredWidth > 0)
        atlas->TexWidth = atlas->TexDesiredWidth;
    else
        atlas->TexWidth = (surface_sqrt >= 4096 * 0.7f) ? 4096 : (surface_sqrt >= 2048 * 0.7f) ? 2048 : (surface_sqrt >= 1024 * 0.7f) ? 1024 : 512;

    // 5. Start packing
    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    const int TEX_HEIGHT_MAX = 1024 * 32;
    stbtt_pack_context spc = {};
    stbtt_PackBegin(&spc, NULL, atlas->TexWidth, TEX_HEIGHT_MAX, 0, atlas->TexGlyphPadding, NULL);
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // 6. Pack each source font. No rendering yet, we are working with rectangles in an infinitely tall texture at this point.
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbrp_pack_rects((stbrp_context*)spc.pack_info, src_tmp.Rects, src_tmp.GlyphsCount);

        // Extend texture height and mark missing glyphs as non-packed so we won't render them.
        // FIXME: We are not handling packing failure here (would happen if we got off TEX_HEIGHT_MAX or if a single if larger than TexWidth?)
        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
            if (src_tmp.Rects[glyph_i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, src_tmp.Rects[glyph_i].y + src_tmp.Rects[glyph_i].h);
    }

    // 7. Allocate texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)IM_ALLOC(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // 8. Render/rasterize font characters into the texture
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        stbtt_PackFontRangesRenderIntoRects(&spc, &src_tmp.FontInfo, &src_tmp.PackRange, 1, src_tmp.Rects);

        // Apply multiply operator
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            stbrp_rect* r = &src_tmp.Rects[0];
            for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++, r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, atlas->TexPixelsAlpha8, r->x, r->y, r->w, r->h, atlas->TexWidth * 1);
        }
        src_tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    buf_rects.clear();

    // 9. Setup ImFont and glyphs for runtime
    for (int src_i = 0; src_i < src_tmp_array.Size; src_i++)
    {
        ImFontBuildSrcData& src_tmp = src_tmp_array[src_i];
        if (src_tmp.GlyphsCount == 0)
            continue;

        // When merging fonts with MergeMode=true:
        // - We can have multiple input fonts writing into a same destination font.
        // - dst_font->ConfigData is != from cfg which is our source configuration.
        ImFontConfig& cfg = atlas->ConfigData[src_i];
        ImFont* dst_font = cfg.DstFont;

        const float font_scale = stbtt_ScaleForPixelHeight(&src_tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&src_tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float font_off_x = cfg.GlyphOffset.x;
        const float font_off_y = cfg.GlyphOffset.y + IM_ROUND(dst_font->Ascent);

        for (int glyph_i = 0; glyph_i < src_tmp.GlyphsCount; glyph_i++)
        {
            // Register glyph
            const int codepoint = src_tmp.GlyphsList[glyph_i];
            const stbtt_packedchar& pc = src_tmp.PackedChars[glyph_i];
            stbtt_aligned_quad q;
            float unused_x = 0.0f, unused_y = 0.0f;
            stbtt_GetPackedQuad(src_tmp.PackedChars, atlas->TexWidth, atlas->TexHeight, glyph_i, &unused_x, &unused_y, &q, 0);
            dst_font->AddGlyph(&cfg, (ImWchar)codepoint, q.x0 + font_off_x, q.y0 + font_off_y, q.x1 + font_off_x, q.y1 + font_off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
        }
    }

    // Cleanup
    src_tmp_array.clear_destruct();

    ImFontAtlasBuildFinish(atlas);
    return true;
}